

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expanddims.cpp
# Opt level: O0

int __thiscall
ncnn::ExpandDims::forward(ExpandDims *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  void *pvVar2;
  void **in_RDX;
  void **in_RSI;
  long in_RDI;
  int axis;
  int i;
  int *axes_ptr;
  bool _expand_c;
  bool _expand_h;
  bool _expand_w;
  int dims;
  int h;
  int w;
  bool local_621;
  Allocator *in_stack_fffffffffffffa48;
  void **ppvVar3;
  undefined8 in_stack_fffffffffffffa50;
  Mat *in_stack_fffffffffffffa58;
  void **ppvVar4;
  undefined7 in_stack_fffffffffffffac0;
  undefined1 uVar5;
  undefined1 local_538 [4];
  int in_stack_fffffffffffffacc;
  undefined4 in_stack_fffffffffffffad0;
  int iVar7;
  undefined4 in_stack_fffffffffffffad4;
  int *piVar8;
  int _w;
  Mat *in_stack_fffffffffffffad8;
  long *local_518;
  void *local_4f0;
  int *local_4e8;
  long *local_4d0;
  void *local_4a8;
  int *local_4a0;
  long *local_488;
  void *local_460;
  int *local_458;
  long *local_440;
  void *local_418;
  int *local_410;
  undefined8 local_408;
  undefined4 local_400;
  long *local_3f8;
  undefined4 local_3f0;
  undefined4 local_3ec;
  undefined4 local_3e8;
  undefined4 local_3e4;
  undefined4 local_3e0;
  undefined8 local_3d8;
  void *local_3c0;
  int *local_3b8;
  undefined8 local_3b0;
  undefined4 local_3a8;
  long *local_3a0;
  undefined4 local_398;
  undefined4 local_394;
  undefined4 local_390;
  undefined4 local_38c;
  undefined4 local_388;
  undefined8 local_380;
  int local_378;
  int local_374;
  long local_370;
  bool local_367;
  bool local_366;
  bool local_365;
  int local_364;
  undefined4 local_360;
  undefined4 local_35c;
  void **local_350;
  int local_334;
  int local_330;
  undefined4 local_32c;
  void **local_328;
  void **local_320;
  int local_310;
  undefined4 local_30c;
  void **local_308;
  void **local_300;
  int local_2f0;
  undefined4 local_2ec;
  void **local_2e8;
  void **local_2e0;
  int local_2d0;
  undefined4 local_2cc;
  void **local_2c8;
  void **local_2c0;
  int local_2b0;
  undefined4 local_2ac;
  void **local_2a8;
  void **local_2a0;
  int local_290;
  undefined4 local_28c;
  void **local_288;
  void **local_280;
  int local_270;
  undefined4 local_26c;
  void **local_268;
  void **local_250;
  void **local_240;
  void **local_230;
  void **local_220;
  void **local_210;
  undefined1 *local_200;
  long *local_1e8;
  long *local_1e0;
  int local_1c8;
  undefined4 local_1c4;
  undefined1 *local_1c0;
  int local_1a8;
  undefined4 local_1a4;
  void **local_1a0;
  int local_188;
  undefined4 local_184;
  void **local_180;
  int local_168;
  undefined4 local_164;
  void **local_160;
  int local_148;
  undefined4 local_144;
  void **local_140;
  int local_128;
  undefined4 local_124;
  void **local_120;
  int local_118;
  undefined4 local_114;
  int local_108;
  undefined4 local_104;
  void **local_100;
  int local_f8;
  undefined4 local_f4;
  void **local_f0;
  int local_e8;
  undefined4 local_e4;
  void **local_e0;
  int local_d8;
  undefined4 local_d4;
  void **local_d0;
  int local_c8;
  undefined4 local_c4;
  void **local_c0;
  int local_b8;
  undefined4 local_b4;
  void **local_b0;
  void *local_a8;
  void *local_a0;
  void *local_98;
  void *local_90;
  void *local_88;
  void *local_80;
  void *local_78;
  long *local_10;
  void *pvVar6;
  
  piVar8 = (int *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0);
  local_35c = *(undefined4 *)((long)in_RSI + 0x2c);
  local_360 = *(undefined4 *)(in_RSI + 6);
  local_364 = *(int *)(in_RSI + 5);
  local_365 = false;
  local_366 = false;
  local_367 = false;
  local_1e8 = (long *)(in_RDI + 0xe0);
  uVar5 = true;
  if (*local_1e8 != 0) {
    uVar5 = *(long *)(in_RDI + 0x120) * (long)*(int *)(in_RDI + 0x118) == 0;
    local_10 = local_1e8;
  }
  if ((bool)uVar5 == false) {
    local_1e0 = (long *)(in_RDI + 0xe0);
    local_370 = *local_1e0;
    for (local_374 = 0; local_374 < *(int *)(in_RDI + 0x10c); local_374 = local_374 + 1) {
      local_378 = *(int *)(local_370 + (long)local_374 * 4);
      if (local_378 < 0) {
        local_378 = local_364 + 1 + local_378;
      }
      if ((local_364 == 1) && (local_378 == 0)) {
        local_366 = true;
      }
      if ((local_364 == 1) && (local_378 == 1)) {
        local_365 = true;
      }
      if ((local_364 == 2) && (local_378 == 0)) {
        local_367 = true;
      }
      if ((local_364 == 2) && (local_378 == 1)) {
        local_366 = true;
      }
      if ((local_364 == 2) && (local_378 == 2)) {
        local_365 = true;
      }
    }
  }
  else {
    local_365 = *(int *)(in_RDI + 0xd0) != 0;
    local_366 = *(int *)(in_RDI + 0xd4) != 0;
    local_367 = *(int *)(in_RDI + 0xd8) != 0;
  }
  local_350 = in_RDX;
  if (in_RDX != in_RSI) {
    if (in_RSI[1] != (void *)0x0) {
      piVar1 = (int *)in_RSI[1];
      local_26c = 1;
      LOCK();
      local_270 = *piVar1;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_268 = in_RSI;
    if (in_RDX[1] != (void *)0x0) {
      piVar1 = (int *)in_RDX[1];
      local_114 = 0xffffffff;
      LOCK();
      local_118 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_118 == 1) {
        if (in_RDX[4] == (void *)0x0) {
          local_78 = *in_RDX;
          if (local_78 != (void *)0x0) {
            free(local_78);
          }
        }
        else {
          (**(code **)(*in_RDX[4] + 0x18))(in_RDX[4],*in_RDX);
        }
      }
    }
    *in_RDX = (void *)0x0;
    in_RDX[2] = (void *)0x0;
    *(undefined4 *)(in_RDX + 3) = 0;
    *(undefined4 *)(in_RDX + 5) = 0;
    *(undefined4 *)((long)in_RDX + 0x2c) = 0;
    *(undefined4 *)(in_RDX + 6) = 0;
    *(undefined4 *)((long)in_RDX + 0x34) = 0;
    *(undefined4 *)(in_RDX + 7) = 0;
    in_RDX[8] = (void *)0x0;
    in_RDX[1] = (void *)0x0;
    *in_RDX = *local_268;
    in_RDX[1] = local_268[1];
    in_RDX[2] = local_268[2];
    *(undefined4 *)(in_RDX + 3) = *(undefined4 *)(local_268 + 3);
    in_RDX[4] = local_268[4];
    *(undefined4 *)(in_RDX + 5) = *(undefined4 *)(local_268 + 5);
    *(undefined4 *)((long)in_RDX + 0x2c) = *(undefined4 *)((long)local_268 + 0x2c);
    *(undefined4 *)(in_RDX + 6) = *(undefined4 *)(local_268 + 6);
    *(undefined4 *)((long)in_RDX + 0x34) = *(undefined4 *)((long)local_268 + 0x34);
    *(undefined4 *)(in_RDX + 7) = *(undefined4 *)(local_268 + 7);
    in_RDX[8] = local_268[8];
  }
  pvVar2 = pvVar6;
  in_stack_fffffffffffffacc = (int)((ulong)pvVar6 >> 0x20);
  if (local_364 == 1) {
    if (((local_365 & 1U) == 0) || ((local_366 & 1U) == 0)) {
      iVar7 = (int)((ulong)in_stack_fffffffffffffa50 >> 0x20);
      pvVar6 = pvVar2;
      if ((local_365 & 1U) == 0) {
        if ((local_366 & 1U) != 0) {
          Mat::reshape(in_stack_fffffffffffffa58,iVar7,(int)in_stack_fffffffffffffa50,
                       in_stack_fffffffffffffa48);
          local_2c0 = local_350;
          local_2c8 = &local_460;
          if (local_350 != local_2c8) {
            if (local_458 != (int *)0x0) {
              local_2cc = 1;
              LOCK();
              local_2d0 = *local_458;
              *local_458 = *local_458 + 1;
              UNLOCK();
            }
            local_e0 = local_350;
            ppvVar3 = local_350;
            ppvVar4 = local_350;
            if (local_350[1] != (void *)0x0) {
              piVar1 = (int *)local_350[1];
              local_e4 = 0xffffffff;
              LOCK();
              local_e8 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_e8 == 1) {
                if (local_350[4] == (void *)0x0) {
                  local_90 = *local_350;
                  if (local_90 != (void *)0x0) {
                    free(local_90);
                  }
                }
                else {
                  (**(code **)(*local_350[4] + 0x18))(local_350[4],*local_350);
                }
              }
            }
            *ppvVar3 = (void *)0x0;
            ppvVar3[2] = (void *)0x0;
            *(undefined4 *)(ppvVar3 + 3) = 0;
            *(undefined4 *)(ppvVar3 + 5) = 0;
            *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
            *(undefined4 *)(ppvVar3 + 6) = 0;
            *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
            *(undefined4 *)(ppvVar3 + 7) = 0;
            ppvVar3[8] = (void *)0x0;
            ppvVar3[1] = (void *)0x0;
            *ppvVar4 = *local_2c8;
            ppvVar4[1] = local_2c8[1];
            ppvVar4[2] = local_2c8[2];
            *(undefined4 *)(ppvVar4 + 3) = *(undefined4 *)(local_2c8 + 3);
            ppvVar4[4] = local_2c8[4];
            *(undefined4 *)(ppvVar4 + 5) = *(undefined4 *)(local_2c8 + 5);
            *(undefined4 *)((long)ppvVar4 + 0x2c) = *(undefined4 *)((long)local_2c8 + 0x2c);
            *(undefined4 *)(ppvVar4 + 6) = *(undefined4 *)(local_2c8 + 6);
            *(undefined4 *)((long)ppvVar4 + 0x34) = *(undefined4 *)((long)local_2c8 + 0x34);
            *(undefined4 *)(ppvVar4 + 7) = *(undefined4 *)(local_2c8 + 7);
            ppvVar4[8] = local_2c8[8];
          }
          ppvVar3 = &local_460;
          local_230 = ppvVar3;
          local_160 = ppvVar3;
          if (local_458 != (int *)0x0) {
            local_164 = 0xffffffff;
            LOCK();
            local_168 = *local_458;
            *local_458 = *local_458 + -1;
            UNLOCK();
            if (local_168 == 1) {
              if (local_440 == (long *)0x0) {
                if (local_460 != (void *)0x0) {
                  free(local_460);
                }
              }
              else {
                (**(code **)(*local_440 + 0x18))(local_440,local_460);
              }
            }
          }
          *ppvVar3 = (void *)0x0;
          ppvVar3[2] = (void *)0x0;
          *(undefined4 *)(ppvVar3 + 3) = 0;
          *(undefined4 *)(ppvVar3 + 5) = 0;
          *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
          *(undefined4 *)(ppvVar3 + 6) = 0;
          *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
          *(undefined4 *)(ppvVar3 + 7) = 0;
          ppvVar3[8] = (void *)0x0;
          ppvVar3[1] = (void *)0x0;
          pvVar2 = pvVar6;
        }
      }
      else {
        Mat::reshape(in_stack_fffffffffffffa58,iVar7,(int)in_stack_fffffffffffffa50,
                     in_stack_fffffffffffffa48);
        ppvVar3 = local_350;
        local_2a0 = local_350;
        local_2a8 = &local_418;
        if (local_350 != local_2a8) {
          if (local_410 != (int *)0x0) {
            local_2ac = 1;
            LOCK();
            local_2b0 = *local_410;
            *local_410 = *local_410 + 1;
            UNLOCK();
          }
          local_f0 = local_350;
          if (local_350[1] != (void *)0x0) {
            piVar1 = (int *)local_350[1];
            local_f4 = 0xffffffff;
            LOCK();
            local_f8 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_f8 == 1) {
              if (local_350[4] == (void *)0x0) {
                local_88 = *local_350;
                if (local_88 != (void *)0x0) {
                  free(local_88);
                }
              }
              else {
                (**(code **)(*local_350[4] + 0x18))(local_350[4],*local_350);
              }
            }
          }
          *ppvVar3 = (void *)0x0;
          ppvVar3[2] = (void *)0x0;
          *(undefined4 *)(ppvVar3 + 3) = 0;
          *(undefined4 *)(ppvVar3 + 5) = 0;
          *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
          *(undefined4 *)(ppvVar3 + 6) = 0;
          *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
          *(undefined4 *)(ppvVar3 + 7) = 0;
          ppvVar3[8] = (void *)0x0;
          ppvVar3[1] = (void *)0x0;
          *ppvVar3 = *local_2a8;
          ppvVar3[1] = local_2a8[1];
          ppvVar3[2] = local_2a8[2];
          *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_2a8 + 3);
          ppvVar3[4] = local_2a8[4];
          *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_2a8 + 5);
          *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_2a8 + 0x2c);
          *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_2a8 + 6);
          *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_2a8 + 0x34);
          *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_2a8 + 7);
          ppvVar3[8] = local_2a8[8];
        }
        local_240 = &local_418;
        local_140 = local_240;
        if (local_410 != (int *)0x0) {
          local_144 = 0xffffffff;
          LOCK();
          local_148 = *local_410;
          *local_410 = *local_410 + -1;
          UNLOCK();
          if (local_148 == 1) {
            if (local_3f8 == (long *)0x0) {
              if (local_418 != (void *)0x0) {
                free(local_418);
              }
            }
            else {
              (**(code **)(*local_3f8 + 0x18))(local_3f8,local_418);
            }
          }
        }
        local_418 = (void *)0x0;
        local_408 = 0;
        local_400 = 0;
        local_3f0 = 0;
        local_3ec = 0;
        local_3e8 = 0;
        local_3e4 = 0;
        local_3e0 = 0;
        local_3d8 = 0;
        local_410 = (int *)0x0;
        pvVar2 = pvVar6;
      }
    }
    else {
      Mat::reshape(in_stack_fffffffffffffad8,(int)((ulong)piVar8 >> 0x20),(int)piVar8,
                   in_stack_fffffffffffffacc,(Allocator *)CONCAT17(uVar5,in_stack_fffffffffffffac0))
      ;
      pvVar6 = pvVar2;
      ppvVar3 = local_350;
      local_280 = local_350;
      local_288 = &local_3c0;
      if (local_350 != local_288) {
        if (local_3b8 != (int *)0x0) {
          local_28c = 1;
          LOCK();
          local_290 = *local_3b8;
          *local_3b8 = *local_3b8 + 1;
          UNLOCK();
        }
        local_100 = local_350;
        if (local_350[1] != (void *)0x0) {
          piVar1 = (int *)local_350[1];
          local_104 = 0xffffffff;
          LOCK();
          local_108 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_108 == 1) {
            if (local_350[4] == (void *)0x0) {
              local_80 = *local_350;
              if (local_80 != (void *)0x0) {
                free(local_80);
              }
            }
            else {
              (**(code **)(*local_350[4] + 0x18))(local_350[4],*local_350);
            }
          }
        }
        *ppvVar3 = (void *)0x0;
        ppvVar3[2] = (void *)0x0;
        *(undefined4 *)(ppvVar3 + 3) = 0;
        *(undefined4 *)(ppvVar3 + 5) = 0;
        *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
        *(undefined4 *)(ppvVar3 + 6) = 0;
        *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
        *(undefined4 *)(ppvVar3 + 7) = 0;
        ppvVar3[8] = (void *)0x0;
        ppvVar3[1] = (void *)0x0;
        *ppvVar3 = *local_288;
        ppvVar3[1] = local_288[1];
        ppvVar3[2] = local_288[2];
        *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_288 + 3);
        ppvVar3[4] = local_288[4];
        *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_288 + 5);
        *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_288 + 0x2c);
        *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_288 + 6);
        *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_288 + 0x34);
        *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_288 + 7);
        ppvVar3[8] = local_288[8];
      }
      local_250 = &local_3c0;
      local_120 = local_250;
      if (local_3b8 != (int *)0x0) {
        local_124 = 0xffffffff;
        LOCK();
        local_128 = *local_3b8;
        *local_3b8 = *local_3b8 + -1;
        UNLOCK();
        if (local_128 == 1) {
          if (local_3a0 == (long *)0x0) {
            if (local_3c0 != (void *)0x0) {
              free(local_3c0);
            }
          }
          else {
            (**(code **)(*local_3a0 + 0x18))(local_3a0,local_3c0);
          }
        }
      }
      local_3c0 = (void *)0x0;
      local_3b0 = 0;
      local_3a8 = 0;
      local_398 = 0;
      local_394 = 0;
      local_390 = 0;
      local_38c = 0;
      local_388 = 0;
      local_380 = 0;
      local_3b8 = (int *)0x0;
      pvVar2 = pvVar6;
    }
  }
  pvVar6 = pvVar2;
  pvVar2 = pvVar6;
  _w = (int)((ulong)piVar8 >> 0x20);
  iVar7 = (int)piVar8;
  in_stack_fffffffffffffacc = (int)((ulong)pvVar6 >> 0x20);
  if (local_364 == 2) {
    if ((local_365 & 1U) == 0) {
      if ((local_366 & 1U) == 0) {
        if ((local_367 & 1U) != 0) {
          Mat::reshape(in_stack_fffffffffffffad8,_w,iVar7,in_stack_fffffffffffffacc,
                       (Allocator *)CONCAT17(uVar5,in_stack_fffffffffffffac0));
          pvVar6 = pvVar2;
          ppvVar3 = local_350;
          local_320 = local_350;
          local_328 = (void **)local_538;
          if (local_350 != local_328) {
            if (piVar8 != (int *)0x0) {
              local_32c = 1;
              LOCK();
              local_330 = *piVar8;
              *piVar8 = *piVar8 + 1;
              UNLOCK();
            }
            local_b0 = local_350;
            if (local_350[1] != (void *)0x0) {
              piVar1 = (int *)local_350[1];
              local_b4 = 0xffffffff;
              LOCK();
              local_b8 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_b8 == 1) {
                if (local_350[4] == (void *)0x0) {
                  local_a8 = *local_350;
                  if (local_a8 != (void *)0x0) {
                    free(local_a8);
                  }
                }
                else {
                  (**(code **)(*local_350[4] + 0x18))(local_350[4],*local_350);
                }
              }
            }
            *ppvVar3 = (void *)0x0;
            ppvVar3[2] = (void *)0x0;
            *(undefined4 *)(ppvVar3 + 3) = 0;
            *(undefined4 *)(ppvVar3 + 5) = 0;
            *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
            *(undefined4 *)(ppvVar3 + 6) = 0;
            *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
            *(undefined4 *)(ppvVar3 + 7) = 0;
            ppvVar3[8] = (void *)0x0;
            ppvVar3[1] = (void *)0x0;
            *ppvVar3 = *local_328;
            ppvVar3[1] = local_328[1];
            ppvVar3[2] = local_328[2];
            *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_328 + 3);
            ppvVar3[4] = local_328[4];
            *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_328 + 5);
            *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_328 + 0x2c);
            *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_328 + 6);
            *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_328 + 0x34);
            *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_328 + 7);
            ppvVar3[8] = local_328[8];
          }
          local_200 = local_538;
          if (piVar8 != (int *)0x0) {
            local_1c4 = 0xffffffff;
            LOCK();
            local_1c8 = *piVar8;
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (local_1c8 == 1) {
              local_1c0 = local_200;
              if (local_518 == (long *)0x0) {
                if (pvVar6 != (void *)0x0) {
                  free(pvVar6);
                }
              }
              else {
                (**(code **)(*local_518 + 0x18))(local_518,pvVar6);
              }
            }
          }
        }
      }
      else {
        Mat::reshape(in_stack_fffffffffffffad8,_w,iVar7,in_stack_fffffffffffffacc,
                     (Allocator *)CONCAT17(uVar5,in_stack_fffffffffffffac0));
        ppvVar3 = local_350;
        local_300 = local_350;
        local_308 = &local_4f0;
        if (local_350 != local_308) {
          if (local_4e8 != (int *)0x0) {
            local_30c = 1;
            LOCK();
            local_310 = *local_4e8;
            *local_4e8 = *local_4e8 + 1;
            UNLOCK();
          }
          local_c0 = local_350;
          if (local_350[1] != (void *)0x0) {
            piVar8 = (int *)local_350[1];
            local_c4 = 0xffffffff;
            LOCK();
            local_c8 = *piVar8;
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (local_c8 == 1) {
              if (local_350[4] == (void *)0x0) {
                local_a0 = *local_350;
                if (local_a0 != (void *)0x0) {
                  free(local_a0);
                }
              }
              else {
                (**(code **)(*local_350[4] + 0x18))(local_350[4],*local_350);
              }
            }
          }
          *ppvVar3 = (void *)0x0;
          ppvVar3[2] = (void *)0x0;
          *(undefined4 *)(ppvVar3 + 3) = 0;
          *(undefined4 *)(ppvVar3 + 5) = 0;
          *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
          *(undefined4 *)(ppvVar3 + 6) = 0;
          *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
          *(undefined4 *)(ppvVar3 + 7) = 0;
          ppvVar3[8] = (void *)0x0;
          ppvVar3[1] = (void *)0x0;
          *ppvVar3 = *local_308;
          ppvVar3[1] = local_308[1];
          ppvVar3[2] = local_308[2];
          *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_308 + 3);
          ppvVar3[4] = local_308[4];
          *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_308 + 5);
          *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_308 + 0x2c);
          *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_308 + 6);
          *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_308 + 0x34);
          *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_308 + 7);
          ppvVar3[8] = local_308[8];
        }
        local_210 = &local_4f0;
        if (local_4e8 != (int *)0x0) {
          local_1a4 = 0xffffffff;
          LOCK();
          local_1a8 = *local_4e8;
          *local_4e8 = *local_4e8 + -1;
          UNLOCK();
          if (local_1a8 == 1) {
            local_1a0 = local_210;
            if (local_4d0 == (long *)0x0) {
              if (local_4f0 != (void *)0x0) {
                free(local_4f0);
              }
            }
            else {
              (**(code **)(*local_4d0 + 0x18))(local_4d0,local_4f0);
            }
          }
        }
      }
    }
    else {
      Mat::reshape(in_stack_fffffffffffffad8,_w,iVar7,in_stack_fffffffffffffacc,
                   (Allocator *)CONCAT17(uVar5,in_stack_fffffffffffffac0));
      ppvVar3 = local_350;
      local_2e0 = local_350;
      local_2e8 = &local_4a8;
      if (local_350 != local_2e8) {
        if (local_4a0 != (int *)0x0) {
          local_2ec = 1;
          LOCK();
          local_2f0 = *local_4a0;
          *local_4a0 = *local_4a0 + 1;
          UNLOCK();
        }
        local_d0 = local_350;
        if (local_350[1] != (void *)0x0) {
          piVar8 = (int *)local_350[1];
          local_d4 = 0xffffffff;
          LOCK();
          local_d8 = *piVar8;
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (local_d8 == 1) {
            if (local_350[4] == (void *)0x0) {
              local_98 = *local_350;
              if (local_98 != (void *)0x0) {
                free(local_98);
              }
            }
            else {
              (**(code **)(*local_350[4] + 0x18))(local_350[4],*local_350);
            }
          }
        }
        *ppvVar3 = (void *)0x0;
        ppvVar3[2] = (void *)0x0;
        *(undefined4 *)(ppvVar3 + 3) = 0;
        *(undefined4 *)(ppvVar3 + 5) = 0;
        *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
        *(undefined4 *)(ppvVar3 + 6) = 0;
        *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
        *(undefined4 *)(ppvVar3 + 7) = 0;
        ppvVar3[8] = (void *)0x0;
        ppvVar3[1] = (void *)0x0;
        *ppvVar3 = *local_2e8;
        ppvVar3[1] = local_2e8[1];
        ppvVar3[2] = local_2e8[2];
        *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_2e8 + 3);
        ppvVar3[4] = local_2e8[4];
        *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_2e8 + 5);
        *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_2e8 + 0x2c);
        *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_2e8 + 6);
        *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_2e8 + 0x34);
        *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_2e8 + 7);
        ppvVar3[8] = local_2e8[8];
      }
      local_220 = &local_4a8;
      if (local_4a0 != (int *)0x0) {
        local_184 = 0xffffffff;
        LOCK();
        local_188 = *local_4a0;
        *local_4a0 = *local_4a0 + -1;
        UNLOCK();
        if (local_188 == 1) {
          local_180 = local_220;
          if (local_488 == (long *)0x0) {
            if (local_4a8 != (void *)0x0) {
              free(local_4a8);
            }
          }
          else {
            (**(code **)(*local_488 + 0x18))(local_488,local_4a8);
          }
        }
      }
    }
  }
  local_621 = true;
  if (*local_350 != (void *)0x0) {
    local_621 = (long)local_350[8] * (long)*(int *)(local_350 + 7) == 0;
  }
  if (local_621) {
    local_334 = -100;
  }
  else {
    local_334 = 0;
  }
  return local_334;
}

Assistant:

int ExpandDims::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int dims = bottom_blob.dims;

    bool _expand_w = false;
    bool _expand_h = false;
    bool _expand_c = false;

    if (axes.empty())
    {
        _expand_w = expand_w;
        _expand_h = expand_h;
        _expand_c = expand_c;
    }
    else
    {
        const int* axes_ptr = axes;
        for (int i = 0; i < axes.w; i++)
        {
            int axis = axes_ptr[i];
            if (axis < 0)
                axis = dims + 1 + axis;

            if (dims == 1 && axis == 0)
            {
                _expand_h = true;
            }
            if (dims == 1 && axis == 1)
            {
                _expand_w = true;
            }
            if (dims == 2 && axis == 0)
            {
                _expand_c = true;
            }
            if (dims == 2 && axis == 1)
            {
                _expand_h = true;
            }
            if (dims == 2 && axis == 2)
            {
                _expand_w = true;
            }
        }
    }

    top_blob = bottom_blob;

    if (dims == 1)
    {
        if (_expand_w && _expand_h)
        {
            top_blob = bottom_blob.reshape(1, w, 1, opt.blob_allocator);
        }
        else if (_expand_w)
        {
            top_blob = bottom_blob.reshape(1, w, opt.blob_allocator);
        }
        else if (_expand_h)
        {
            top_blob = bottom_blob.reshape(w, 1, opt.blob_allocator);
        }
    }

    if (dims == 2)
    {
        if (_expand_w)
        {
            top_blob = bottom_blob.reshape(1, w, h, opt.blob_allocator);
        }
        else if (_expand_h)
        {
            top_blob = bottom_blob.reshape(w, 1, h, opt.blob_allocator);
        }
        else if (_expand_c)
        {
            top_blob = bottom_blob.reshape(w, h, 1, opt.blob_allocator);
        }
    }

    if (top_blob.empty())
        return -100;

    return 0;
}